

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application_glfw.cpp
# Opt level: O2

void __thiscall
Application::removeInputHandler(Application *this,shared_ptr<InputHandler> *inputHandler)

{
  element_type *peVar1;
  __normal_iterator<std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
  __first;
  
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<InputHandler>*,std::vector<std::shared_ptr<InputHandler>,std::allocator<std::shared_ptr<InputHandler>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<InputHandler>const>>
                      ((this->_inputHandlers).
                       super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_inputHandlers).
                       super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_equals_val<const_std::shared_ptr<InputHandler>_>)inputHandler);
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::erase
            (&this->_inputHandlers,(const_iterator)__first._M_current,
             (this->_inputHandlers).
             super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  peVar1 = (inputHandler->super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_InputHandler[2])(peVar1,this->_window);
  return;
}

Assistant:

void Application::removeInputHandler(std::shared_ptr<InputHandler> inputHandler) {
    auto first = std::remove(_inputHandlers.begin(), _inputHandlers.end(), inputHandler);
    _inputHandlers.erase(first, _inputHandlers.end());
    inputHandler->removed(_window);
}